

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  istream *piVar2;
  ostream *poVar3;
  string id;
  Parser par;
  string local_180;
  undefined1 *local_160;
  long local_158;
  undefined1 local_150 [16];
  string local_140;
  Parser local_120;
  
  local_160 = local_150;
  local_158 = 0;
  local_150[0] = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,anon_var_dwarf_1d92 + 1,0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  while( true ) {
    piVar2 = std::operator>>((istream *)&std::cin,(string *)&local_160);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_140,local_160,local_160 + local_158);
    Parser::Parser(&local_120,&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    bVar1 = Parser::check(&local_120);
    if (bVar1) {
      Parser::parse(&local_120);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_1d14,0x18);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_1d1e,0xd);
      Parser::get_address_abi_cxx11_(&local_180,&local_120);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_180._M_dataplus._M_p,
                          local_180._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_1d34,0xf);
      Parser::get_year(&local_120);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,anon_var_dwarf_1d4a,3);
      Parser::get_month(&local_120);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,anon_var_dwarf_1d60,3);
      Parser::get_day(&local_120);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,anon_var_dwarf_1d6a,3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_1d74,0xd);
      Parser::get_sex_abi_cxx11_(&local_180,&local_120);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_180._M_dataplus._M_p,
                          local_180._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_1d7e,0xd);
      Parser::get_animal_abi_cxx11_(&local_180,&local_120);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_180._M_dataplus._M_p,
                          local_180._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_1d88,0xd);
      Parser::get_star_abi_cxx11_(&local_180,&local_120);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_180._M_dataplus._M_p,
                          local_180._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_1d0a,0x18);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_1d92,0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.sex._M_dataplus._M_p != &local_120.sex.field_2) {
      operator_delete(local_120.sex._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.star._M_dataplus._M_p != &local_120.star.field_2) {
      operator_delete(local_120.star._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.animal._M_dataplus._M_p != &local_120.animal.field_2) {
      operator_delete(local_120.animal._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.address._M_dataplus._M_p != &local_120.address.field_2) {
      operator_delete(local_120.address._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.id._M_dataplus._M_p != &local_120.id.field_2) {
      operator_delete(local_120.id._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.provfile._M_dataplus._M_p != &local_120.provfile.field_2) {
      operator_delete(local_120.provfile._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.dir._M_dataplus._M_p != &local_120.dir.field_2) {
      operator_delete(local_120.dir._M_dataplus._M_p);
    }
  }
  if (local_160 != local_150) {
    operator_delete(local_160);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    string id;
    cout << "请输入身份证号：" << endl;
    while (cin >> id) {
        Parser par(id);
        if (!par.check()) {
            cout << "身份证号不正确！" << endl;
        } else {
            par.parse();
            cout << "查得个人信息为：" << endl;
            cout << "地    址：" << par.get_address() << endl;
            cout << "出生日期：" << par.get_year() << "年" << par.get_month() << "月" << par.get_day() << "日" << endl;
            cout << "性    别：" << par.get_sex() << endl;
            cout << "属    相：" << par.get_animal() << endl;
            cout << "星    座：" << par.get_star() << endl;
        }
        cout << "\n请输入身份证号：" << endl;
    }
    return 0;
}